

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
insert_simplex_and_subfaces<std::initializer_list<short>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          initializer_list<short> *Nsimplex,Filtration_value *filtration)

{
  int iVar1;
  pointer piVar2;
  pointer __first;
  long lVar3;
  short *psVar4;
  Filtration_value *filt;
  vector<int,_std::allocator<int>_> *pvVar5;
  int iVar6;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var7;
  undefined8 *puVar8;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var9;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar10;
  
  piVar2 = (filtration->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 == (pointer)0x0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    __first = (filtration->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    if ((char)in_FS_OFFSET[-9] == '\0') {
      in_FS_OFFSET[-10] = 0;
      in_FS_OFFSET[-0xc] = 0;
      in_FS_OFFSET[-0xb] = 0;
      __cxa_thread_atexit(std::vector<short,_std::allocator<short>_>::~vector,*in_FS_OFFSET + -0x60,
                          &__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -9) = 1;
    }
    lVar3 = *in_FS_OFFSET;
    psVar4 = (short *)in_FS_OFFSET[-0xc];
    __position._M_current = (short *)in_FS_OFFSET[-0xb];
    if ((short *)in_FS_OFFSET[-0xb] != psVar4) {
      in_FS_OFFSET[-0xb] = (long)psVar4;
      __position._M_current = psVar4;
    }
    std::vector<short,std::allocator<short>>::insert<short_const*,void>
              ((vector<short,std::allocator<short>> *)(lVar3 + -0x60),__position,(short *)__first,
               (short *)((long)__first + (long)piVar2 * 2));
    std::
    __sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (in_FS_OFFSET[-0xc],in_FS_OFFSET[-0xb]);
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0xc],in_FS_OFFSET[-0xb]);
    std::vector<short,_std::allocator<short>_>::erase
              ((vector<short,_std::allocator<short>_> *)(lVar3 + -0x60),
               (const_iterator)_Var7._M_current,(short *)in_FS_OFFSET[-0xb]);
    _Var7._M_current = (short *)in_FS_OFFSET[-0xc];
    filt = (Filtration_value *)in_FS_OFFSET[-0xb];
    _Var9._M_current = _Var7._M_current;
    while ((Filtration_value *)_Var9._M_current != filt) {
      pvVar5 = &((Filtration_value *)_Var9._M_current)->super_vector<int,_std::allocator<int>_>;
      _Var9._M_current =
           (short *)((long)&(((Filtration_value *)_Var9._M_current)->
                            super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 2);
      if (*(short *)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start == (short)Nsimplex[3]._M_len) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
    }
    iVar6 = (int)((ulong)((long)filt - (long)_Var7._M_current) >> 1) + -1;
    iVar1 = (int)Nsimplex[8]._M_len;
    if (iVar6 < iVar1) {
      iVar6 = iVar1;
    }
    *(int *)&Nsimplex[8]._M_len = iVar6;
    pVar10 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                        (Nsimplex + 4),_Var7,filt);
    filtration = pVar10._8_8_;
  }
  pVar10._8_8_ = filtration;
  pVar10.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar10;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }